

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O0

QueueSubmission *
vkt::sparse::anon_unknown_2::makeSubmissionSparse
          (QueueSubmission *__return_storage_ptr__,Queue *queue,deUint32 numWaitSemaphores,
          VkSemaphore *pWaitSemaphore,deUint32 numSignalSemaphores,VkSemaphore *pSignalSemaphore)

{
  undefined4 local_90 [2];
  VkBindSparseInfo bindInfo;
  VkSemaphore *pSignalSemaphore_local;
  deUint32 numSignalSemaphores_local;
  VkSemaphore *pWaitSemaphore_local;
  deUint32 numWaitSemaphores_local;
  Queue *queue_local;
  
  local_90[0] = 7;
  bindInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bindInfo._4_4_ = 0;
  bindInfo.pWaitSemaphores._0_4_ = 0;
  bindInfo.bufferBindCount = 0;
  bindInfo._36_4_ = 0;
  bindInfo.pBufferBinds._0_4_ = 0;
  bindInfo.imageOpaqueBindCount = 0;
  bindInfo._52_4_ = 0;
  bindInfo.pImageOpaqueBinds._0_4_ = 0;
  bindInfo.imageBindCount = 0;
  bindInfo._68_4_ = 0;
  __return_storage_ptr__->isSparseBinding = true;
  __return_storage_ptr__->queue = queue;
  bindInfo.pNext._0_4_ = numWaitSemaphores;
  bindInfo._16_8_ = pWaitSemaphore;
  bindInfo.pImageBinds._0_4_ = numSignalSemaphores;
  bindInfo._80_8_ = pSignalSemaphore;
  bindInfo.pSignalSemaphores = pSignalSemaphore;
  memcpy(&__return_storage_ptr__->info,local_90,0x60);
  return __return_storage_ptr__;
}

Assistant:

QueueSubmission makeSubmissionSparse (const Queue*			queue,
									  const deUint32		numWaitSemaphores,
									  const VkSemaphore*	pWaitSemaphore,
									  const deUint32		numSignalSemaphores,
									  const VkSemaphore*	pSignalSemaphore)
{
	const VkBindSparseInfo bindInfo =
	{
		VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			// VkStructureType                             sType;
		DE_NULL,									// const void*                                 pNext;
		numWaitSemaphores,							// uint32_t                                    waitSemaphoreCount;
		pWaitSemaphore,								// const VkSemaphore*                          pWaitSemaphores;
		0u,											// uint32_t                                    bufferBindCount;
		DE_NULL,									// const VkSparseBufferMemoryBindInfo*         pBufferBinds;
		0u,											// uint32_t                                    imageOpaqueBindCount;
		DE_NULL,									// const VkSparseImageOpaqueMemoryBindInfo*    pImageOpaqueBinds;
		0u,											// uint32_t                                    imageBindCount;
		DE_NULL,									// const VkSparseImageMemoryBindInfo*          pImageBinds;
		numSignalSemaphores,						// uint32_t                                    signalSemaphoreCount;
		pSignalSemaphore,							// const VkSemaphore*                          pSignalSemaphores;
	};

	QueueSubmission submission;
	submission.isSparseBinding	= true;
	submission.queue			= queue;
	submission.info.sparse		= bindInfo;

	return submission;
}